

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_CDict *
ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  size_t sVar1;
  void *start;
  ZSTD_CDict *cdict;
  ZSTD_cwksp *pZVar2;
  ZSTD_CCtx_params *pZVar3;
  ZSTD_cwksp *pZVar4;
  undefined8 *puVar5;
  U32 enableDedicatedDictSearch;
  long lVar6;
  size_t __size;
  ZSTD_paramSwitch_e useRowMatchFinder;
  byte bVar7;
  ZSTD_CCtx_params in_stack_fffffffffffffda8;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params cctxParams;
  ZSTD_cwksp local_78;
  
  bVar7 = 0;
  memcpy(&cctxParams,originalCctxParams,0xd0);
  enableDedicatedDictSearch = cctxParams.enableDedicatedDictSearch;
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    if (cctxParams.enableDedicatedDictSearch == 0) {
      ZSTD_getCParamsFromCCtxParams
                (&cParams,&cctxParams,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
    }
    else {
      ZSTD_getCParams_internal(&cParams,cctxParams.compressionLevel,0,dictSize,ZSTD_cpm_createCDict)
      ;
      if (cParams.strategy - ZSTD_greedy < 3) {
        cParams.hashLog = cParams.hashLog + 2;
      }
      ZSTD_overrideCParams(&cParams,&cctxParams.cParams);
    }
    if ((2 < cParams.strategy - ZSTD_greedy) ||
       (cParams.hashLog <= cParams.chainLog || 0x18 < cParams.chainLog)) {
      cctxParams.enableDedicatedDictSearch = 0;
      ZSTD_getCParamsFromCCtxParams
                (&cParams,&cctxParams,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      enableDedicatedDictSearch = 0;
    }
    cctxParams.cParams.hashLog = cParams.hashLog;
    useRowMatchFinder = cctxParams.useRowMatchFinder;
    if (cctxParams.useRowMatchFinder == ZSTD_ps_auto) {
      if (cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
        useRowMatchFinder = ZSTD_ps_disable;
      }
      else {
        useRowMatchFinder = (cParams.windowLog < 0xf) + ZSTD_ps_enable;
      }
    }
    cctxParams.useRowMatchFinder = useRowMatchFinder;
    sVar1 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,enableDedicatedDictSearch,0);
    lVar6 = (dictSize + 7 & 0xfffffffffffffff8) + 0x39c0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      lVar6 = 0x39c0;
    }
    __size = lVar6 + sVar1;
    if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
      start = malloc(__size);
    }
    else {
      start = (*customMem.customAlloc)(customMem.opaque,__size);
    }
    if (start == (void *)0x0) {
      cdict = (ZSTD_CDict *)0x0;
    }
    else {
      ZSTD_cwksp_init(&local_78,start,__size,ZSTD_cwksp_dynamic_alloc);
      cdict = (ZSTD_CDict *)ZSTD_cwksp_reserve_object(&local_78,0x17c0);
      if (cdict == (ZSTD_CDict *)0x0) {
        __assert_fail("cdict != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x65ca,
                      "ZSTD_CDict *ZSTD_createCDict_advanced_internal(size_t, ZSTD_dictLoadMethod_e, ZSTD_compressionParameters, ZSTD_paramSwitch_e, U32, ZSTD_customMem)"
                     );
      }
      pZVar2 = &local_78;
      pZVar4 = &cdict->workspace;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pZVar4->workspace = pZVar2->workspace;
        pZVar2 = (ZSTD_cwksp *)((long)pZVar2 + ((ulong)bVar7 * -2 + 1) * 8);
        pZVar4 = (ZSTD_cwksp *)((long)pZVar4 + (ulong)bVar7 * -0x10 + 8);
      }
      (cdict->customMem).customAlloc = customMem.customAlloc;
      (cdict->customMem).customFree = customMem.customFree;
      (cdict->customMem).opaque = customMem.opaque;
      cdict->compressionLevel = 0;
      cdict->useRowMatchFinder = useRowMatchFinder;
    }
    pZVar3 = &cctxParams;
    puVar5 = (undefined8 *)&stack0xfffffffffffffda8;
    for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *(undefined8 *)pZVar3;
      pZVar3 = (ZSTD_CCtx_params *)((long)pZVar3 + (ulong)bVar7 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    }
    sVar1 = ZSTD_initCDict_internal
                      (cdict,dict,dictSize,dictLoadMethod,dictContentType,in_stack_fffffffffffffda8)
    ;
    if (sVar1 < 0xffffffffffffff89) {
      return cdict;
    }
    ZSTD_freeCDict(cdict);
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}